

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

void initialDistanceFieldFactor(void)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  QMessageLogger *in_stack_ffffffffffffff30;
  QDebug in_stack_ffffffffffffff38;
  QDebug local_a0;
  char *in_stack_ffffffffffffff68;
  QDebug local_78 [5];
  QDebug local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (!initialDistanceFieldFactor::initialized) {
    initialDistanceFieldFactor::initialized = true;
    uVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE");
    if ((uVar2 & 1) != 0) {
      QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE",(bool *)0x0);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      lcDistanceField();
      anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x702c3b);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (char *)0x702c51);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff38.stream,in_stack_ffffffffffffff68);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        QDebug::~QDebug(&local_50);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
    }
    uVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_SCALE");
    if ((uVar2 & 1) != 0) {
      QT_DISTANCEFIELD_DEFAULT_SCALE =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_SCALE",(bool *)0x0);
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcDistanceField();
      anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x702d1f);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (char *)0x702d35);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff38.stream,in_stack_ffffffffffffff68);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        QDebug::~QDebug(local_78);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
    }
    uVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_RADIUS");
    if ((uVar2 & 1) != 0) {
      QT_DISTANCEFIELD_DEFAULT_RADIUS =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_RADIUS",(bool *)0x0);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      lcDistanceField();
      anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x702df7);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (char *)0x702e0d);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff38.stream,in_stack_ffffffffffffff68);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        QDebug::~QDebug(&local_a0);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
    }
    uVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT");
    if ((uVar2 & 1) != 0) {
      QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT",(bool *)0x0);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      lcDistanceField();
      anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
        anon_unknown.dwarf_1075b6e::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x702ecf);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (char *)0x702ee3);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff38.stream,in_stack_ffffffffffffff68);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff38);
        local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void initialDistanceFieldFactor()
{
    static bool initialized = false;
    if (initialized)
        return;
    initialized = true;

    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE")) {
        QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE:" << QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE;
    }

    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_SCALE")) {
        QT_DISTANCEFIELD_DEFAULT_SCALE = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_SCALE");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_SCALE:" << QT_DISTANCEFIELD_DEFAULT_SCALE;
    }
    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_RADIUS")) {
        QT_DISTANCEFIELD_DEFAULT_RADIUS = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_RADIUS");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_RADIUS:" << QT_DISTANCEFIELD_DEFAULT_RADIUS;
    }
    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT")) {
        QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT:" << QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT;
    }
}